

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitPop
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Pop *curr)

{
  pointer pLVar1;
  char cVar2;
  Type TVar3;
  undefined1 local_60 [8];
  value_type ret;
  
  pLVar1 = (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
      _M_impl.super__Vector_impl_data._M_start == pLVar1) {
    __assert_fail("!multiValues.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                  ,0x114d,
                  "Flow wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitPop(Pop *) [SubType = wasm::ModuleRunner]"
                 );
  }
  SmallVector<wasm::Literal,_1UL>::SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)local_60,
             &pLVar1[-1].super_SmallVector<wasm::Literal,_1UL>);
  TVar3 = Literals::getType((Literals *)local_60);
  cVar2 = wasm::Type::isSubType(TVar3,(Type)*(uintptr_t *)(curr + 8));
  if (cVar2 != '\0') {
    std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::pop_back(&this->multiValues);
    Flow::Flow(__return_storage_ptr__,(Literals *)local_60);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_60);
    return __return_storage_ptr__;
  }
  __assert_fail("Type::isSubType(ret.getType(), curr->type)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                ,0x114f,
                "Flow wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitPop(Pop *) [SubType = wasm::ModuleRunner]"
               );
}

Assistant:

Flow visitPop(Pop* curr) {
    NOTE_ENTER("Pop");
    assert(!multiValues.empty());
    auto ret = multiValues.back();
    assert(Type::isSubType(ret.getType(), curr->type));
    multiValues.pop_back();
    return ret;
  }